

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O3

unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> __thiscall
duckdb::ArrowType::GetTypeFromFormat(ArrowType *this,string *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  int iVar4;
  reference pvVar5;
  unsigned_long_long val;
  unsigned_long_long val_00;
  unsigned_long_long uVar6;
  element_type *peVar7;
  InvalidInputException *pIVar8;
  NotImplementedException *pNVar9;
  LogicalTypeId *args;
  bool bVar10;
  string parameters_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  extra_info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  parameters;
  uint8_t in_stack_ffffffffffffff1d;
  uint8_t in_stack_ffffffffffffff1e;
  string local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar4 = ::std::__cxx11::string::compare((char *)format);
  if (iVar4 == 0) {
    peVar7 = (element_type *)operator_new(0x68);
    LogicalType::LogicalType((LogicalType *)&local_e0,SQLNULL);
  }
  else {
    iVar4 = ::std::__cxx11::string::compare((char *)format);
    if (iVar4 == 0) {
      peVar7 = (element_type *)operator_new(0x68);
      LogicalType::LogicalType((LogicalType *)&local_e0,BOOLEAN);
    }
    else {
      iVar4 = ::std::__cxx11::string::compare((char *)format);
      if (iVar4 == 0) {
        peVar7 = (element_type *)operator_new(0x68);
        LogicalType::LogicalType((LogicalType *)&local_e0,TINYINT);
      }
      else {
        iVar4 = ::std::__cxx11::string::compare((char *)format);
        if (iVar4 == 0) {
          peVar7 = (element_type *)operator_new(0x68);
          LogicalType::LogicalType((LogicalType *)&local_e0,SMALLINT);
        }
        else {
          iVar4 = ::std::__cxx11::string::compare((char *)format);
          if (iVar4 != 0) {
            iVar4 = ::std::__cxx11::string::compare((char *)format);
            if (iVar4 == 0) {
              args = &LogicalType::BIGINT;
            }
            else {
              iVar4 = ::std::__cxx11::string::compare((char *)format);
              if (iVar4 == 0) {
                args = &LogicalType::UTINYINT;
              }
              else {
                iVar4 = ::std::__cxx11::string::compare((char *)format);
                if (iVar4 == 0) {
                  args = &LogicalType::USMALLINT;
                }
                else {
                  iVar4 = ::std::__cxx11::string::compare((char *)format);
                  if (iVar4 == 0) {
                    args = &LogicalType::UINTEGER;
                  }
                  else {
                    iVar4 = ::std::__cxx11::string::compare((char *)format);
                    if (iVar4 == 0) {
                      args = &LogicalType::UBIGINT;
                    }
                    else {
                      iVar4 = ::std::__cxx11::string::compare((char *)format);
                      if (iVar4 == 0) {
                        args = &LogicalType::FLOAT;
                      }
                      else {
                        iVar4 = ::std::__cxx11::string::compare((char *)format);
                        if (iVar4 != 0) {
                          if (*(format->_M_dataplus)._M_p == 'd') {
                            StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                               *)&local_c0,(string *)format,':');
                            if (local_c0._8_8_ - local_c0._0_8_ != 0x40) {
                              pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
                              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
                              ::std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_e0,
                                         "Decimal format of Arrow object is incomplete, it is missing the scale and width. Current format: %s"
                                         ,"");
                              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                              pcVar3 = (format->_M_dataplus)._M_p;
                              ::std::__cxx11::string::_M_construct<char*>
                                        ((string *)&local_50,pcVar3,
                                         pcVar3 + format->_M_string_length);
                              InvalidInputException::InvalidInputException<std::__cxx11::string>
                                        (pIVar8,(string *)&local_e0,&local_50);
                              __cxa_throw(pIVar8,&InvalidInputException::typeinfo,
                                          ::std::runtime_error::~runtime_error);
                            }
                            pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                                  *)&local_c0,1);
                            paVar1 = &local_e0.field_2;
                            local_e0._M_dataplus._M_p = (pointer)paVar1;
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_e0,",","");
                            StringUtil::Split(&local_a8,(string *)pvVar5,&local_e0);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_e0._M_dataplus._M_p != paVar1) {
                              operator_delete(local_e0._M_dataplus._M_p);
                            }
                            if (((long)local_a8.
                                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 CONCAT71(local_a8.
                                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                          local_a8.
                                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start._0_1_) &
                                0xffffffffffffffc0U) == 0x40) {
                              pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                       ::operator[](&local_a8,0);
                              val = ::std::__cxx11::stoull(pvVar5,(size_t *)0x0,10);
                              pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                       ::operator[](&local_a8,1);
                              val_00 = ::std::__cxx11::stoull(pvVar5,(size_t *)0x0,10);
                              if ((long)local_a8.
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  CONCAT71(local_a8.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                           local_a8.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start._0_1_) == 0x60)
                              {
                                pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                         ::operator[](&local_a8,2);
                                uVar6 = ::std::__cxx11::stoull(pvVar5,(size_t *)0x0,10);
                                bVar10 = 0x80 < uVar6;
                              }
                              else {
                                bVar10 = false;
                              }
                              if ((val < 0x27) && (!bVar10)) {
                                NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert(val);
                                NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert
                                          (val_00);
                                LogicalType::DECIMAL
                                          (in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1d);
                                make_uniq<duckdb::ArrowType,duckdb::LogicalType>
                                          ((duckdb *)this,(LogicalType *)&local_e0);
                                LogicalType::~LogicalType((LogicalType *)&local_e0);
                                ::std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&local_a8);
                                ::std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)local_c0._M_local_buf);
                                return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                                        )this;
                              }
                              pNVar9 = (NotImplementedException *)__cxa_allocate_exception(0x10);
                              local_e0._M_dataplus._M_p = (pointer)paVar1;
                              ::std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_e0,
                                         "Unsupported Internal Arrow Type for Decimal %s","");
                              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                              pcVar3 = (format->_M_dataplus)._M_p;
                              ::std::__cxx11::string::_M_construct<char*>
                                        ((string *)&local_90,pcVar3,
                                         pcVar3 + format->_M_string_length);
                              NotImplementedException::NotImplementedException<std::__cxx11::string>
                                        (pNVar9,(string *)&local_e0,&local_90);
                              __cxa_throw(pNVar9,&NotImplementedException::typeinfo,
                                          ::std::runtime_error::~runtime_error);
                            }
                            pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
                            local_e0._M_dataplus._M_p = (pointer)paVar1;
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_e0,
                                       "Decimal format of Arrow object is incomplete, it is missing the scale or width. Current format: %s"
                                       ,"");
                            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                            pcVar3 = (format->_M_dataplus)._M_p;
                            ::std::__cxx11::string::_M_construct<char*>
                                      ((string *)&local_70,pcVar3,pcVar3 + format->_M_string_length)
                            ;
                            InvalidInputException::InvalidInputException<std::__cxx11::string>
                                      (pIVar8,(string *)&local_e0,&local_70);
                            __cxa_throw(pIVar8,&InvalidInputException::typeinfo,
                                        ::std::runtime_error::~runtime_error);
                          }
                          iVar4 = ::std::__cxx11::string::compare((char *)format);
                          if (iVar4 == 0) {
                            local_c0._M_allocated_capacity =
                                 local_c0._M_allocated_capacity & 0xffffffffffffff00;
                            make_uniq<duckdb::ArrowStringInfo,duckdb::ArrowVariableSizeType>
                                      ((duckdb *)&local_e0,
                                       (ArrowVariableSizeType *)&local_c0._M_allocated_capacity);
                            make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
                                      ((duckdb *)this,&LogicalType::VARCHAR,
                                       (unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                                        *)&local_e0);
                          }
                          else {
                            iVar4 = ::std::__cxx11::string::compare((char *)format);
                            if (iVar4 == 0) {
                              local_c0._M_local_buf[0] = 2;
                              make_uniq<duckdb::ArrowStringInfo,duckdb::ArrowVariableSizeType>
                                        ((duckdb *)&local_e0,
                                         (ArrowVariableSizeType *)&local_c0._M_allocated_capacity);
                              make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
                                        ((duckdb *)this,&LogicalType::VARCHAR,
                                         (unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                                          *)&local_e0);
                            }
                            else {
                              iVar4 = ::std::__cxx11::string::compare((char *)format);
                              if (iVar4 != 0) {
                                iVar4 = ::std::__cxx11::string::compare((char *)format);
                                if (iVar4 == 0) {
                                  local_e0._M_dataplus._M_p._0_1_ = 0x14;
                                }
                                else {
                                  iVar4 = ::std::__cxx11::string::compare((char *)format);
                                  if (iVar4 == 0) {
                                    local_e0._M_dataplus._M_p._0_1_ = 0x13;
                                  }
                                  else {
                                    iVar4 = ::std::__cxx11::string::compare((char *)format);
                                    if (iVar4 == 0) {
                                      local_e0._M_dataplus._M_p._0_1_ = 0x12;
                                    }
                                    else {
                                      iVar4 = ::std::__cxx11::string::compare((char *)format);
                                      if (iVar4 != 0) {
                                        iVar4 = ::std::__cxx11::string::compare((char *)format);
                                        if (iVar4 == 0) {
                                          local_c0._M_local_buf[0] = 4;
                                          make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                    ((duckdb *)&local_e0,
                                                     (ArrowDateTimeType *)
                                                     &local_c0._M_allocated_capacity);
                                          make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                    ((duckdb *)this,&LogicalType::DATE,
                                                     (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)&local_e0);
                                        }
                                        else {
                                          iVar4 = ::std::__cxx11::string::compare((char *)format);
                                          if (iVar4 == 0) {
                                            local_c0._M_allocated_capacity =
                                                 local_c0._M_allocated_capacity & 0xffffffffffffff00
                                            ;
                                            make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                      ((duckdb *)&local_e0,
                                                       (ArrowDateTimeType *)
                                                       &local_c0._M_allocated_capacity);
                                            make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                      ((duckdb *)this,&LogicalType::DATE,
                                                       (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)&local_e0);
                                          }
                                          else {
                                            iVar4 = ::std::__cxx11::string::compare((char *)format);
                                            if (iVar4 == 0) {
                                              local_c0._M_local_buf[0] = 3;
                                              make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                        ((duckdb *)&local_e0,
                                                         (ArrowDateTimeType *)
                                                         &local_c0._M_allocated_capacity);
                                              make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                        ((duckdb *)this,&LogicalType::TIME,
                                                         (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)&local_e0);
                                            }
                                            else {
                                              iVar4 = ::std::__cxx11::string::compare
                                                                ((char *)format);
                                              if (iVar4 == 0) {
                                                local_c0._M_allocated_capacity =
                                                     local_c0._M_allocated_capacity &
                                                     0xffffffffffffff00;
                                                make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                          ((duckdb *)&local_e0,
                                                           (ArrowDateTimeType *)
                                                           &local_c0._M_allocated_capacity);
                                                make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                          ((duckdb *)this,&LogicalType::TIME,
                                                           (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)&local_e0);
                                              }
                                              else {
                                                iVar4 = ::std::__cxx11::string::compare
                                                                  ((char *)format);
                                                if (iVar4 == 0) {
                                                  local_c0._M_local_buf[0] = 1;
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)&local_e0,
                                                             (ArrowDateTimeType *)
                                                             &local_c0._M_allocated_capacity);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::TIME,
                                                             (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)&local_e0);
                                                }
                                                else {
                                                  iVar4 = ::std::__cxx11::string::compare
                                                                    ((char *)format);
                                                  if (iVar4 == 0) {
                                                    local_c0._M_local_buf[0] = 2;
                                                                                                        
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)&local_e0,
                                                             (ArrowDateTimeType *)
                                                             &local_c0._M_allocated_capacity);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::TIME,
                                                             (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)&local_e0);
                                                  }
                                                  else {
                                                    iVar4 = ::std::__cxx11::string::compare
                                                                      ((char *)format);
                                                    if (iVar4 == 0) {
                                                      local_c0._M_local_buf[0] = 3;
                                                                                                            
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)&local_e0,
                                                             (ArrowDateTimeType *)
                                                             &local_c0._M_allocated_capacity);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::INTERVAL,
                                                             (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)&local_e0);
                                                  }
                                                  else {
                                                    iVar4 = ::std::__cxx11::string::compare
                                                                      ((char *)format);
                                                    if (iVar4 == 0) {
                                                      local_c0._M_allocated_capacity =
                                                           local_c0._M_allocated_capacity &
                                                           0xffffffffffffff00;
                                                                                                            
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)&local_e0,
                                                             (ArrowDateTimeType *)
                                                             &local_c0._M_allocated_capacity);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::INTERVAL,
                                                             (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)&local_e0);
                                                  }
                                                  else {
                                                    iVar4 = ::std::__cxx11::string::compare
                                                                      ((char *)format);
                                                    if (iVar4 == 0) {
                                                      local_c0._M_local_buf[0] = 1;
                                                                                                            
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)&local_e0,
                                                             (ArrowDateTimeType *)
                                                             &local_c0._M_allocated_capacity);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::INTERVAL,
                                                             (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)&local_e0);
                                                  }
                                                  else {
                                                    iVar4 = ::std::__cxx11::string::compare
                                                                      ((char *)format);
                                                    if (iVar4 == 0) {
                                                      local_c0._M_local_buf[0] = 2;
                                                                                                            
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)&local_e0,
                                                             (ArrowDateTimeType *)
                                                             &local_c0._M_allocated_capacity);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::INTERVAL,
                                                             (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)&local_e0);
                                                  }
                                                  else {
                                                    iVar4 = ::std::__cxx11::string::compare
                                                                      ((char *)format);
                                                    if (iVar4 == 0) {
                                                      local_c0._M_local_buf[0] = 4;
                                                                                                            
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)&local_e0,
                                                             (ArrowDateTimeType *)
                                                             &local_c0._M_allocated_capacity);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::INTERVAL,
                                                             (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)&local_e0);
                                                  }
                                                  else {
                                                    iVar4 = ::std::__cxx11::string::compare
                                                                      ((char *)format);
                                                    if (iVar4 == 0) {
                                                      local_c0._M_local_buf[0] = 5;
                                                                                                            
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)&local_e0,
                                                             (ArrowDateTimeType *)
                                                             &local_c0._M_allocated_capacity);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::INTERVAL,
                                                             (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)&local_e0);
                                                  }
                                                  else {
                                                    iVar4 = ::std::__cxx11::string::compare
                                                                      ((char *)format);
                                                    if (iVar4 == 0) {
                                                      local_c0._M_local_buf[0] = 6;
                                                                                                            
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)&local_e0,
                                                             (ArrowDateTimeType *)
                                                             &local_c0._M_allocated_capacity);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::INTERVAL,
                                                             (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)&local_e0);
                                                  }
                                                  else {
                                                    iVar4 = ::std::__cxx11::string::compare
                                                                      ((char *)format);
                                                    if (iVar4 == 0) {
                                                      local_c0._M_allocated_capacity =
                                                           local_c0._M_allocated_capacity &
                                                           0xffffffffffffff00;
                                                                                                            
                                                  make_uniq<duckdb::ArrowStringInfo,duckdb::ArrowVariableSizeType>
                                                            ((duckdb *)&local_e0,
                                                             (ArrowVariableSizeType *)
                                                             &local_c0._M_allocated_capacity);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::BLOB,
                                                             (
                                                  unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                                                  *)&local_e0);
                                                  }
                                                  else {
                                                    iVar4 = ::std::__cxx11::string::compare
                                                                      ((char *)format);
                                                    if (iVar4 != 0) {
                                                      pcVar2 = (format->_M_dataplus)._M_p;
                                                      if (*pcVar2 == 't') {
                                                        if (pcVar2[1] == 's') {
                                                          switch(pcVar2[2]) {
                                                          case 'm':
                                                            local_a8.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_ =
                                                       (duckdb)0x0;
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)&local_e0,
                                                             (ArrowDateTimeType *)&local_a8);
                                                  break;
                                                  case 'n':
                                                    local_a8.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_ =
                                                       (duckdb)0x2;
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)&local_e0,
                                                             (ArrowDateTimeType *)&local_a8);
                                                  break;
                                                  default:
                                                    pNVar9 = (NotImplementedException *)
                                                             __cxa_allocate_exception(0x10);
                                                    local_e0._M_dataplus._M_p =
                                                         (pointer)&local_e0.field_2;
                                                    ::std::__cxx11::string::
                                                    _M_construct<char_const*>
                                                              ((string *)&local_e0,
                                                                                                                              
                                                  " Timestamptz precision of not accepted","");
                                                  NotImplementedException::NotImplementedException
                                                            (pNVar9,&local_e0);
                                                  __cxa_throw(pNVar9,&NotImplementedException::
                                                                      typeinfo,
                                                              ::std::runtime_error::~runtime_error);
                                                  case 's':
                                                    local_a8.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_ =
                                                       (duckdb)0x3;
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)&local_e0,
                                                             (ArrowDateTimeType *)&local_a8);
                                                  break;
                                                  case 'u':
                                                    local_a8.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_ =
                                                       (duckdb)0x1;
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)&local_e0,
                                                             (ArrowDateTimeType *)&local_a8);
                                                  }
                                                  local_c0._M_allocated_capacity =
                                                       (size_type)local_e0._M_dataplus._M_p;
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowTypeInfo,std::default_delete<duckdb::ArrowTypeInfo>,true>>
                                                            ((duckdb *)this,
                                                             &LogicalType::TIMESTAMP_TZ,
                                                             (
                                                  unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>
                                                  *)&local_c0._M_allocated_capacity);
                                                  local_e0._M_dataplus._M_p =
                                                       (pointer)local_c0._M_allocated_capacity;
                                                  goto LAB_0115c6e5;
                                                  }
                                                  }
                                                  else if (*pcVar2 == 'w') {
                                                    ::std::__cxx11::string::find((char)format,0x3a);
                                                    ::std::__cxx11::string::substr
                                                              ((ulong)&local_e0,(ulong)format);
                                                    iVar4 = ::std::__cxx11::stoi
                                                                      ((string *)&local_e0,
                                                                       (size_t *)0x0,10);
                                                    local_c0._M_allocated_capacity =
                                                         NumericCastImpl<unsigned_long,_int,_false>
                                                         ::Convert(iVar4);
                                                                                                        
                                                  make_uniq<duckdb::ArrowStringInfo,unsigned_long&>
                                                            ((duckdb *)&local_a8,
                                                             &local_c0._M_allocated_capacity);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::BLOB,
                                                             (
                                                  unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                                                  *)&local_a8);
                                                  if ((long *)CONCAT71(local_a8.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  local_a8.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_)
                                                  != (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(local_a8.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  local_a8.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                                  8))();
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_e0._M_dataplus._M_p == &local_e0.field_2)
                                                  {
                                                    return (
                                                  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                                                  )this;
                                                  }
                                                  operator_delete(local_e0._M_dataplus._M_p);
                                                  return (
                                                  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                                                  )this;
                                                  }
                                                  (this->extension_data).internal.
                                                  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr = (element_type *)0x0;
                                                  return (
                                                  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                                                  )this;
                                                  }
                                                  local_c0._M_local_buf[0] = 2;
                                                  make_uniq<duckdb::ArrowStringInfo,duckdb::ArrowVariableSizeType>
                                                            ((duckdb *)&local_e0,
                                                             (ArrowVariableSizeType *)
                                                             &local_c0._M_allocated_capacity);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::BLOB,
                                                             (
                                                  unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                                                  *)&local_e0);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                        goto LAB_0115c6e5;
                                      }
                                      local_e0._M_dataplus._M_p._0_1_ = 0x11;
                                    }
                                  }
                                }
                                make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId>
                                          ((duckdb *)this,(LogicalTypeId *)&local_e0);
                                return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                                        )this;
                              }
                              local_c0._M_local_buf[0] = 3;
                              make_uniq<duckdb::ArrowStringInfo,duckdb::ArrowVariableSizeType>
                                        ((duckdb *)&local_e0,
                                         (ArrowVariableSizeType *)&local_c0._M_allocated_capacity);
                              make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
                                        ((duckdb *)this,&LogicalType::VARCHAR,
                                         (unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                                          *)&local_e0);
                            }
                          }
LAB_0115c6e5:
                          if ((long *)local_e0._M_dataplus._M_p == (long *)0x0) {
                            return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                                    )this;
                          }
                          (**(code **)(*(long *)local_e0._M_dataplus._M_p + 8))();
                          return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                                  )this;
                        }
                        args = &LogicalType::DOUBLE;
                      }
                    }
                  }
                }
              }
            }
            make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&>((duckdb *)this,args);
            return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>)this
            ;
          }
          peVar7 = (element_type *)operator_new(0x68);
          LogicalType::LogicalType((LogicalType *)&local_e0,INTEGER);
        }
      }
    }
  }
  peVar7->arrow_to_duckdb = (cast_arrow_duck_t)0x0;
  peVar7->duckdb_to_arrow = (cast_duck_arrow_t)0x0;
  LogicalType::LogicalType(&peVar7->duckdb_type,(LogicalType *)&local_e0);
  (peVar7->internal_type).id_ = INVALID;
  (peVar7->internal_type).physical_type_ = ~INVALID;
  *(undefined6 *)&(peVar7->internal_type).field_0x2 = 0;
  *(undefined1 *)
   &(peVar7->internal_type).type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(peVar7->internal_type).type_info_.internal + 8))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar7[1].arrow_to_duckdb = (cast_arrow_duck_t)&peVar7[1].duckdb_type;
  peVar7[1].duckdb_to_arrow = (cast_duck_arrow_t)0x0;
  peVar7[1].duckdb_type.id_ = INVALID;
  *(undefined1 *)
   &((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&peVar7[1].duckdb_type.type_info_.internal + 8))->_M_pi = 0;
  (this->extension_data).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
  LogicalType::~LogicalType((LogicalType *)&local_e0);
  return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
         (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)this;
}

Assistant:

unique_ptr<ArrowType> ArrowType::GetTypeFromFormat(string &format) {
	if (format == "n") {
		return make_uniq<ArrowType>(LogicalType::SQLNULL);
	} else if (format == "b") {
		return make_uniq<ArrowType>(LogicalType::BOOLEAN);
	} else if (format == "c") {
		return make_uniq<ArrowType>(LogicalType::TINYINT);
	} else if (format == "s") {
		return make_uniq<ArrowType>(LogicalType::SMALLINT);
	} else if (format == "i") {
		return make_uniq<ArrowType>(LogicalType::INTEGER);
	} else if (format == "l") {
		return make_uniq<ArrowType>(LogicalType::BIGINT);
	} else if (format == "C") {
		return make_uniq<ArrowType>(LogicalType::UTINYINT);
	} else if (format == "S") {
		return make_uniq<ArrowType>(LogicalType::USMALLINT);
	} else if (format == "I") {
		return make_uniq<ArrowType>(LogicalType::UINTEGER);
	} else if (format == "L") {
		return make_uniq<ArrowType>(LogicalType::UBIGINT);
	} else if (format == "f") {
		return make_uniq<ArrowType>(LogicalType::FLOAT);
	} else if (format == "g") {
		return make_uniq<ArrowType>(LogicalType::DOUBLE);
	} else if (format[0] == 'd') { //! this can be either decimal128 or decimal 256 (e.g., d:38,0)
		auto extra_info = StringUtil::Split(format, ':');
		if (extra_info.size() != 2) {
			throw InvalidInputException(
			    "Decimal format of Arrow object is incomplete, it is missing the scale and width. Current format: %s",
			    format);
		}
		auto parameters = StringUtil::Split(extra_info[1], ",");
		// Parameters must always be 2 or 3 values (i.e., width, scale and an optional bit-width)
		if (parameters.size() != 2 && parameters.size() != 3) {
			throw InvalidInputException(
			    "Decimal format of Arrow object is incomplete, it is missing the scale or width. Current format: %s",
			    format);
		}
		uint64_t width = std::stoull(parameters[0]);
		uint64_t scale = std::stoull(parameters[1]);
		uint64_t bitwidth = 128;
		if (parameters.size() == 3) {
			// We have a bit-width defined
			bitwidth = std::stoull(parameters[2]);
		}
		if (width > 38 || bitwidth > 128) {
			throw NotImplementedException("Unsupported Internal Arrow Type for Decimal %s", format);
		}
		return make_uniq<ArrowType>(LogicalType::DECIMAL(NumericCast<uint8_t>(width), NumericCast<uint8_t>(scale)));
	} else if (format == "u") {
		return make_uniq<ArrowType>(LogicalType::VARCHAR, make_uniq<ArrowStringInfo>(ArrowVariableSizeType::NORMAL));
	} else if (format == "U") {
		return make_uniq<ArrowType>(LogicalType::VARCHAR,
		                            make_uniq<ArrowStringInfo>(ArrowVariableSizeType::SUPER_SIZE));
	} else if (format == "vu") {
		return make_uniq<ArrowType>(LogicalType::VARCHAR, make_uniq<ArrowStringInfo>(ArrowVariableSizeType::VIEW));
	} else if (format == "tsn:") {
		return make_uniq<ArrowType>(LogicalTypeId::TIMESTAMP_NS);
	} else if (format == "tsu:") {
		return make_uniq<ArrowType>(LogicalTypeId::TIMESTAMP);
	} else if (format == "tsm:") {
		return make_uniq<ArrowType>(LogicalTypeId::TIMESTAMP_MS);
	} else if (format == "tss:") {
		return make_uniq<ArrowType>(LogicalTypeId::TIMESTAMP_SEC);
	} else if (format == "tdD") {
		return make_uniq<ArrowType>(LogicalType::DATE, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::DAYS));
	} else if (format == "tdm") {
		return make_uniq<ArrowType>(LogicalType::DATE, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MILLISECONDS));
	} else if (format == "tts") {
		return make_uniq<ArrowType>(LogicalType::TIME, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::SECONDS));
	} else if (format == "ttm") {
		return make_uniq<ArrowType>(LogicalType::TIME, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MILLISECONDS));
	} else if (format == "ttu") {
		return make_uniq<ArrowType>(LogicalType::TIME, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MICROSECONDS));
	} else if (format == "ttn") {
		return make_uniq<ArrowType>(LogicalType::TIME, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::NANOSECONDS));
	} else if (format == "tDs") {
		return make_uniq<ArrowType>(LogicalType::INTERVAL, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::SECONDS));
	} else if (format == "tDm") {
		return make_uniq<ArrowType>(LogicalType::INTERVAL,
		                            make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MILLISECONDS));
	} else if (format == "tDu") {
		return make_uniq<ArrowType>(LogicalType::INTERVAL,
		                            make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MICROSECONDS));
	} else if (format == "tDn") {
		return make_uniq<ArrowType>(LogicalType::INTERVAL,
		                            make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::NANOSECONDS));
	} else if (format == "tiD") {
		return make_uniq<ArrowType>(LogicalType::INTERVAL, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::DAYS));
	} else if (format == "tiM") {
		return make_uniq<ArrowType>(LogicalType::INTERVAL, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MONTHS));
	} else if (format == "tin") {
		return make_uniq<ArrowType>(LogicalType::INTERVAL,
		                            make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MONTH_DAY_NANO));
	} else if (format == "z") {
		auto type_info = make_uniq<ArrowStringInfo>(ArrowVariableSizeType::NORMAL);
		return make_uniq<ArrowType>(LogicalType::BLOB, std::move(type_info));
	} else if (format == "Z") {
		auto type_info = make_uniq<ArrowStringInfo>(ArrowVariableSizeType::SUPER_SIZE);
		return make_uniq<ArrowType>(LogicalType::BLOB, std::move(type_info));
	} else if (format[0] == 'w') {
		string parameters = format.substr(format.find(':') + 1);
		auto fixed_size = NumericCast<idx_t>(std::stoi(parameters));
		auto type_info = make_uniq<ArrowStringInfo>(fixed_size);
		return make_uniq<ArrowType>(LogicalType::BLOB, std::move(type_info));
	} else if (format[0] == 't' && format[1] == 's') {
		// Timestamp with Timezone
		// TODO right now we just get the UTC value. We probably want to support this properly in the future
		unique_ptr<ArrowTypeInfo> type_info;
		if (format[2] == 'n') {
			type_info = make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::NANOSECONDS);
		} else if (format[2] == 'u') {
			type_info = make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MICROSECONDS);
		} else if (format[2] == 'm') {
			type_info = make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MILLISECONDS);
		} else if (format[2] == 's') {
			type_info = make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::SECONDS);
		} else {
			throw NotImplementedException(" Timestamptz precision of not accepted");
		}
		return make_uniq<ArrowType>(LogicalType::TIMESTAMP_TZ, std::move(type_info));
	}
	return nullptr;
}